

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O0

void __thiscall
protozero::
basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
add_bytes(basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,pbf_tag_type tag,char *value,size_t size)

{
  uint uVar1;
  assert_error *paVar2;
  size_t size_local;
  char *value_local;
  pbf_tag_type tag_local;
  basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  if (this->m_pos != 0) {
    paVar2 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error
              (paVar2,
               "m_pos == 0 && \"you can\'t add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage\""
              );
    __cxa_throw(paVar2,&assert_error::typeinfo,assert_error::~assert_error);
  }
  if (this->m_data == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    paVar2 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(paVar2,"m_data");
    __cxa_throw(paVar2,&assert_error::typeinfo,assert_error::~assert_error);
  }
  uVar1 = Catch::clara::std::numeric_limits<unsigned_int>::max();
  if (uVar1 < size) {
    paVar2 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(paVar2,"size <= std::numeric_limits<pbf_length_type>::max()");
    __cxa_throw(paVar2,&assert_error::typeinfo,assert_error::~assert_error);
  }
  add_length_varint(this,tag,(pbf_length_type)size);
  buffer_customization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::append((string *)this->m_data,value,size);
  return;
}

Assistant:

void add_bytes(pbf_tag_type tag, const char* value, std::size_t size) {
        protozero_assert(m_pos == 0 && "you can't add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage");
        protozero_assert(m_data);
        protozero_assert(size <= std::numeric_limits<pbf_length_type>::max());
        add_length_varint(tag, static_cast<pbf_length_type>(size));
        buffer_customization<TBuffer>::append(m_data, value, size);
    }